

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O1

void gjkepa2_impl::Initialize
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,sResults *results,tShape *shape,bool withmargins)

{
  float fVar1;
  float fVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  float fVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  float fVar12;
  cbtScalar cVar13;
  cbtScalar cVar14;
  cbtScalar cVar15;
  cbtScalar cVar16;
  cbtScalar cVar17;
  cbtScalar cVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  code *pcVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  results->witnesses[1].m_floats[3] = 0.0;
  results->status = Separated;
  results->witnesses[0].m_floats[0] = 0.0;
  results->witnesses[0].m_floats[1] = 0.0;
  results->witnesses[0].m_floats[2] = 0.0;
  *(undefined8 *)(results->witnesses[0].m_floats + 3) = 0;
  results->witnesses[1].m_floats[1] = 0.0;
  results->witnesses[1].m_floats[2] = 0.0;
  shape->m_shapes[0] = shape0;
  shape->m_shapes[1] = shape1;
  fVar1 = (wtrs1->m_basis).m_el[1].m_floats[0];
  fVar2 = (wtrs0->m_basis).m_el[1].m_floats[0];
  cVar3 = (wtrs0->m_basis).m_el[0].m_floats[0];
  cVar4 = (wtrs0->m_basis).m_el[0].m_floats[1];
  cVar5 = (wtrs1->m_basis).m_el[0].m_floats[0];
  cVar6 = (wtrs1->m_basis).m_el[0].m_floats[1];
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),ZEXT416((uint)cVar5),ZEXT416((uint)cVar3)
                           );
  cVar7 = (wtrs1->m_basis).m_el[2].m_floats[0];
  cVar8 = (wtrs0->m_basis).m_el[2].m_floats[0];
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar7),ZEXT416((uint)cVar8));
  fVar9 = (wtrs0->m_basis).m_el[1].m_floats[1];
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar1)),ZEXT416((uint)cVar5),ZEXT416((uint)cVar4)
                           );
  cVar10 = (wtrs0->m_basis).m_el[2].m_floats[1];
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar7),ZEXT416((uint)cVar10));
  cVar11 = (wtrs0->m_basis).m_el[0].m_floats[2];
  fVar12 = (wtrs0->m_basis).m_el[1].m_floats[2];
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar1)),ZEXT416((uint)cVar11),
                            ZEXT416((uint)cVar5));
  cVar5 = (wtrs0->m_basis).m_el[2].m_floats[2];
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar5),ZEXT416((uint)cVar7));
  fVar1 = (wtrs1->m_basis).m_el[1].m_floats[1];
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar1)),ZEXT416((uint)cVar6),ZEXT416((uint)cVar3)
                           );
  cVar7 = (wtrs1->m_basis).m_el[2].m_floats[1];
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)cVar7),ZEXT416((uint)cVar8));
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar9),ZEXT416((uint)fVar1));
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar6),ZEXT416((uint)cVar4));
  auVar26 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar7),ZEXT416((uint)cVar10));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar1)),ZEXT416((uint)cVar11),
                            ZEXT416((uint)cVar6));
  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar5),ZEXT416((uint)cVar7));
  cVar6 = (wtrs1->m_basis).m_el[0].m_floats[2];
  fVar1 = (wtrs1->m_basis).m_el[1].m_floats[2];
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),ZEXT416((uint)cVar6),ZEXT416((uint)cVar3)
                           );
  cVar3 = (wtrs1->m_basis).m_el[2].m_floats[2];
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)cVar3),ZEXT416((uint)cVar8));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar1)),ZEXT416((uint)cVar6),ZEXT416((uint)cVar4)
                           );
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar3),ZEXT416((uint)cVar10));
  auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar1)),ZEXT416((uint)cVar6),
                            ZEXT416((uint)cVar11));
  auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)cVar3),ZEXT416((uint)cVar5));
  (shape->m_toshape1).m_el[0].m_floats[0] = auVar27._0_4_;
  (shape->m_toshape1).m_el[0].m_floats[1] = auVar21._0_4_;
  (shape->m_toshape1).m_el[0].m_floats[2] = auVar22._0_4_;
  (shape->m_toshape1).m_el[0].m_floats[3] = 0.0;
  (shape->m_toshape1).m_el[1].m_floats[0] = auVar23._0_4_;
  (shape->m_toshape1).m_el[1].m_floats[1] = auVar26._0_4_;
  (shape->m_toshape1).m_el[1].m_floats[2] = auVar25._0_4_;
  (shape->m_toshape1).m_el[1].m_floats[3] = 0.0;
  (shape->m_toshape1).m_el[2].m_floats[0] = auVar32._0_4_;
  (shape->m_toshape1).m_el[2].m_floats[1] = auVar28._0_4_;
  (shape->m_toshape1).m_el[2].m_floats[2] = auVar29._0_4_;
  (shape->m_toshape1).m_el[2].m_floats[3] = 0.0;
  fVar12 = (wtrs1->m_origin).m_floats[0] - (wtrs0->m_origin).m_floats[0];
  fVar19 = (wtrs1->m_origin).m_floats[1] - (wtrs0->m_origin).m_floats[1];
  fVar20 = (wtrs1->m_origin).m_floats[2] - (wtrs0->m_origin).m_floats[2];
  fVar1 = (wtrs0->m_basis).m_el[1].m_floats[0];
  fVar2 = (wtrs1->m_basis).m_el[1].m_floats[0];
  cVar3 = (wtrs1->m_basis).m_el[0].m_floats[0];
  cVar4 = (wtrs1->m_basis).m_el[0].m_floats[1];
  cVar5 = (wtrs0->m_basis).m_el[0].m_floats[0];
  cVar6 = (wtrs0->m_basis).m_el[0].m_floats[1];
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),ZEXT416((uint)cVar5),ZEXT416((uint)cVar3)
                           );
  cVar7 = (wtrs0->m_basis).m_el[2].m_floats[0];
  cVar8 = (wtrs1->m_basis).m_el[2].m_floats[0];
  auVar21 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar7),ZEXT416((uint)cVar8));
  fVar9 = (wtrs1->m_basis).m_el[1].m_floats[1];
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar1)),ZEXT416((uint)cVar5),ZEXT416((uint)cVar4)
                           );
  cVar10 = (wtrs1->m_basis).m_el[2].m_floats[1];
  auVar22 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar7),ZEXT416((uint)cVar10));
  cVar11 = (wtrs1->m_basis).m_el[0].m_floats[2];
  cVar13 = (wtrs1->m_basis).m_el[1].m_floats[2];
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)cVar13));
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar5),ZEXT416((uint)cVar11));
  cVar14 = (wtrs1->m_basis).m_el[2].m_floats[2];
  auVar28 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar7),ZEXT416((uint)cVar14));
  cVar15 = (wtrs0->m_basis).m_el[1].m_floats[1];
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)cVar15));
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar6),ZEXT416((uint)cVar3));
  cVar16 = (wtrs0->m_basis).m_el[2].m_floats[1];
  auVar29 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar16),ZEXT416((uint)cVar8));
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar9),ZEXT416((uint)cVar15));
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar6),ZEXT416((uint)cVar4));
  auVar26 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar16),ZEXT416((uint)cVar10));
  auVar27 = vmulss_avx512f(ZEXT416((uint)cVar13),ZEXT416((uint)cVar15));
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar6),ZEXT416((uint)cVar11));
  auVar30 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar16),ZEXT416((uint)cVar14));
  cVar17 = (wtrs0->m_basis).m_el[0].m_floats[2];
  cVar18 = (wtrs0->m_basis).m_el[1].m_floats[2];
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)cVar18));
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar17),ZEXT416((uint)cVar3));
  cVar3 = (wtrs0->m_basis).m_el[2].m_floats[2];
  auVar23 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar3),ZEXT416((uint)cVar8));
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar9),ZEXT416((uint)cVar18));
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar17),ZEXT416((uint)cVar4));
  auVar25 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar3),ZEXT416((uint)cVar10));
  auVar27 = vmulss_avx512f(ZEXT416((uint)cVar13),ZEXT416((uint)cVar18));
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar17),ZEXT416((uint)cVar11));
  auVar31 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar3),ZEXT416((uint)cVar14));
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar1)),ZEXT416((uint)fVar12),
                            ZEXT416((uint)cVar5));
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar20),ZEXT416((uint)cVar7));
  auVar32 = vmulss_avx512f(ZEXT416((uint)fVar19),ZEXT416((uint)cVar15));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar12),ZEXT416((uint)cVar6));
  auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)fVar20),ZEXT416((uint)cVar16));
  auVar27 = vinsertps_avx(auVar27,auVar32,0x10);
  auVar32 = vmulss_avx512f(ZEXT416((uint)fVar19),ZEXT416((uint)cVar18));
  auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)cVar17),ZEXT416((uint)fVar12));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)cVar3),ZEXT416((uint)fVar20));
  auVar27 = vinsertps_avx(auVar27,auVar32,0x28);
  (shape->m_toshape0).m_basis.m_el[0].m_floats[0] = auVar21._0_4_;
  (shape->m_toshape0).m_basis.m_el[0].m_floats[1] = auVar22._0_4_;
  (shape->m_toshape0).m_basis.m_el[0].m_floats[2] = auVar28._0_4_;
  (shape->m_toshape0).m_basis.m_el[0].m_floats[3] = 0.0;
  (shape->m_toshape0).m_basis.m_el[1].m_floats[0] = auVar29._0_4_;
  (shape->m_toshape0).m_basis.m_el[1].m_floats[1] = auVar26._0_4_;
  (shape->m_toshape0).m_basis.m_el[1].m_floats[2] = auVar30._0_4_;
  (shape->m_toshape0).m_basis.m_el[1].m_floats[3] = 0.0;
  (shape->m_toshape0).m_basis.m_el[2].m_floats[0] = auVar23._0_4_;
  (shape->m_toshape0).m_basis.m_el[2].m_floats[1] = auVar25._0_4_;
  (shape->m_toshape0).m_basis.m_el[2].m_floats[2] = auVar31._0_4_;
  (shape->m_toshape0).m_basis.m_el[2].m_floats[3] = 0.0;
  *(undefined1 (*) [16])(shape->m_toshape0).m_origin.m_floats = auVar27;
  if (withmargins) {
    pcVar24 = cbtConvexShape::localGetSupportVertexNonVirtual;
  }
  else {
    pcVar24 = cbtConvexShape::localGetSupportVertexWithoutMarginNonVirtual;
  }
  shape->Ls = (offset_in_cbtConvexShape_to_subr)pcVar24;
  *(undefined8 *)&shape->field_0x88 = 0;
  return;
}

Assistant:

static void Initialize(const cbtConvexShape* shape0, const cbtTransform& wtrs0,
					   const cbtConvexShape* shape1, const cbtTransform& wtrs1,
					   cbtGjkEpaSolver2::sResults& results,
					   tShape& shape,
					   bool withmargins)
{
	/* Results		*/
	results.witnesses[0] =
		results.witnesses[1] = cbtVector3(0, 0, 0);
	results.status = cbtGjkEpaSolver2::sResults::Separated;
	/* Shape		*/
	shape.m_shapes[0] = shape0;
	shape.m_shapes[1] = shape1;
	shape.m_toshape1 = wtrs1.getBasis().transposeTimes(wtrs0.getBasis());
	shape.m_toshape0 = wtrs0.inverseTimes(wtrs1);
	shape.EnableMargin(withmargins);
}